

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_writer.cpp
# Opt level: O0

void __thiscall
duckdb::SingleFileTableDataWriter::FinalizeTable
          (SingleFileTableDataWriter *this,TableStatistics *global_stats,DataTableInfo *info,
          Serializer *serializer)

{
  bool bVar1;
  reference pRVar2;
  ulong uVar3;
  BinarySerializer *this_00;
  undefined1 extraout_DL;
  DataTableInfo *in_RDX;
  BinarySerializer *in_RDI;
  vector<duckdb::BlockPointer,_true> compat_block_pointers;
  vector<duckdb::IndexStorageInfo,_true> index_storage_infos;
  case_insensitive_map_t<Value> options;
  bool v1_0_0_storage;
  BinarySerializer row_group_serializer;
  uint64_t row_group_count;
  RowGroupPointer *row_group_pointer;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::RowGroupPointer,_true> *__range1;
  idx_t total_rows;
  BinarySerializer stats_serializer;
  MetaBlockPointer pointer;
  Serializer *in_stack_fffffffffffff3b8;
  vector<duckdb::BlockPointer,_true> *value;
  BinarySerializer *in_stack_fffffffffffff3c0;
  undefined6 in_stack_fffffffffffff3c8;
  undefined1 in_stack_fffffffffffff3ce;
  undefined1 in_stack_fffffffffffff3cf;
  Serializer *in_stack_fffffffffffff3d0;
  SerializationOptions *in_stack_fffffffffffff3e0;
  SerializationOptions *options_p;
  WriteStream *in_stack_fffffffffffff3e8;
  WriteStream *stream;
  vector<duckdb::BlockPointer,_true> local_bf8 [2];
  Serializer *local_bc8;
  Serializer *in_stack_fffffffffffff448;
  TableStatistics *in_stack_fffffffffffff450;
  ulong local_b58;
  case_insensitive_map_t<Value> *in_stack_fffffffffffff580;
  TableIndexList *in_stack_fffffffffffff588;
  __normal_iterator<duckdb::RowGroupPointer_*,_std::vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>_>
  local_5c0;
  size_type *local_5b8;
  ulong local_5b0;
  MetaBlockPointer local_30;
  DataTableInfo *local_18;
  
  local_18 = in_RDX;
  local_30 = MetadataWriter::GetMetaBlockPointer((MetadataWriter *)in_stack_fffffffffffff3d0);
  Serializer::GetOptions(in_stack_fffffffffffff3b8);
  BinarySerializer::BinarySerializer(in_RDI,in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0);
  SerializationOptions::~SerializationOptions((SerializationOptions *)0x19716de);
  BinarySerializer::Begin((BinarySerializer *)0x19716eb);
  TableStatistics::Serialize(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  BinarySerializer::End((BinarySerializer *)0x1971711);
  stream = *(WriteStream **)
            &(in_RDI->super_Serializer).options.serialization_compatibility.manually_set;
  ::std::vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>::size
            ((vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_> *)
             &(in_RDI->super_Serializer).options.serialization_compatibility.duckdb_version.
              _M_string_length);
  WriteStream::Write<unsigned_long>
            ((WriteStream *)in_stack_fffffffffffff3c0,(unsigned_long)in_stack_fffffffffffff3b8);
  local_5b0 = 0;
  local_5b8 = &(in_RDI->super_Serializer).options.serialization_compatibility.duckdb_version.
               _M_string_length;
  local_5c0._M_current =
       (RowGroupPointer *)
       ::std::vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>::begin
                 ((vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_> *)
                  in_stack_fffffffffffff3b8);
  ::std::vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>::end
            ((vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_> *)
             in_stack_fffffffffffff3b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::RowGroupPointer_*,_std::vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>_>
                        *)in_stack_fffffffffffff3c0,
                       (__normal_iterator<duckdb::RowGroupPointer_*,_std::vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>_>
                        *)in_stack_fffffffffffff3b8);
    if (!bVar1) break;
    pRVar2 = __gnu_cxx::
             __normal_iterator<duckdb::RowGroupPointer_*,_std::vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>_>
             ::operator*(&local_5c0);
    uVar3 = pRVar2->row_start + pRVar2->tuple_count;
    if (local_5b0 < uVar3) {
      local_5b0 = uVar3;
    }
    options_p = *(SerializationOptions **)
                 &(in_RDI->super_Serializer).options.serialization_compatibility.manually_set;
    Serializer::GetOptions(in_stack_fffffffffffff3b8);
    BinarySerializer::BinarySerializer(in_RDI,stream,options_p);
    SerializationOptions::~SerializationOptions((SerializationOptions *)0x1971883);
    BinarySerializer::Begin((BinarySerializer *)0x1971890);
    RowGroup::Serialize((RowGroupPointer *)in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
    BinarySerializer::End((BinarySerializer *)0x19718b6);
    BinarySerializer::~BinarySerializer(in_stack_fffffffffffff3c0);
    __gnu_cxx::
    __normal_iterator<duckdb::RowGroupPointer_*,_std::vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>_>
    ::operator++(&local_5c0);
  }
  Serializer::WriteProperty<duckdb::MetaBlockPointer>
            (in_stack_fffffffffffff3d0,CONCAT11(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3ce)
             ,(char *)in_stack_fffffffffffff3c0,(MetaBlockPointer *)in_stack_fffffffffffff3b8);
  Serializer::WriteProperty<unsigned_long>
            (in_stack_fffffffffffff3d0,CONCAT11(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3ce)
             ,(char *)in_stack_fffffffffffff3c0,(unsigned_long *)in_stack_fffffffffffff3b8);
  Serializer::GetOptions(in_stack_fffffffffffff3b8);
  SerializationOptions::~SerializationOptions((SerializationOptions *)0x197199d);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)0x19719b7);
  if (2 < local_b58) {
    in_stack_fffffffffffff3d0 =
         (Serializer *)
         ::std::
         unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>
         ::emplace<char_const(&)[15],bool&>
                   ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                     *)in_stack_fffffffffffff3d0,
                    (char (*) [15])
                    CONCAT17(in_stack_fffffffffffff3cf,
                             CONCAT16(in_stack_fffffffffffff3ce,in_stack_fffffffffffff3c8)),
                    (bool *)in_stack_fffffffffffff3c0);
    in_stack_fffffffffffff3cf = extraout_DL;
    local_bc8 = in_stack_fffffffffffff3d0;
  }
  this_00 = (BinarySerializer *)DataTableInfo::GetIndexes(local_18);
  TableIndexList::GetStorageInfos(in_stack_fffffffffffff588,in_stack_fffffffffffff580);
  value = local_bf8;
  vector<duckdb::BlockPointer,_true>::vector((vector<duckdb::BlockPointer,_true> *)0x1971a56);
  Serializer::WriteProperty<duckdb::vector<duckdb::BlockPointer,true>>
            (in_stack_fffffffffffff3d0,CONCAT11(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3ce)
             ,(char *)this_00,value);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::IndexStorageInfo,true>>
            (in_stack_fffffffffffff3d0,CONCAT11(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3ce)
             ,(char *)this_00,(vector<duckdb::IndexStorageInfo,_true> *)value);
  vector<duckdb::BlockPointer,_true>::~vector((vector<duckdb::BlockPointer,_true> *)0x1971a9f);
  vector<duckdb::IndexStorageInfo,_true>::~vector
            ((vector<duckdb::IndexStorageInfo,_true> *)0x1971aa9);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                    *)0x1971ab6);
  BinarySerializer::~BinarySerializer(this_00);
  return;
}

Assistant:

void SingleFileTableDataWriter::FinalizeTable(const TableStatistics &global_stats, DataTableInfo *info,
                                              Serializer &serializer) {

	// store the current position in the metadata writer
	// this is where the row groups for this table start
	auto pointer = table_data_writer.GetMetaBlockPointer();

	// Serialize statistics as a single unit
	BinarySerializer stats_serializer(table_data_writer, serializer.GetOptions());
	stats_serializer.Begin();
	global_stats.Serialize(stats_serializer);
	stats_serializer.End();

	// now start writing the row group pointers to disk
	table_data_writer.Write<uint64_t>(row_group_pointers.size());
	idx_t total_rows = 0;
	for (auto &row_group_pointer : row_group_pointers) {
		auto row_group_count = row_group_pointer.row_start + row_group_pointer.tuple_count;
		if (row_group_count > total_rows) {
			total_rows = row_group_count;
		}

		// Each RowGroup is its own unit
		BinarySerializer row_group_serializer(table_data_writer, serializer.GetOptions());
		row_group_serializer.Begin();
		RowGroup::Serialize(row_group_pointer, row_group_serializer);
		row_group_serializer.End();
	}

	// Now begin the metadata as a unit
	// Pointer to the table itself goes to the metadata stream.
	serializer.WriteProperty(101, "table_pointer", pointer);
	serializer.WriteProperty(102, "total_rows", total_rows);

	auto v1_0_0_storage = serializer.GetOptions().serialization_compatibility.serialization_version < 3;
	case_insensitive_map_t<Value> options;
	if (!v1_0_0_storage) {
		options.emplace("v1_0_0_storage", v1_0_0_storage);
	}
	auto index_storage_infos = info->GetIndexes().GetStorageInfos(options);

#ifdef DUCKDB_BLOCK_VERIFICATION
	for (auto &entry : index_storage_infos) {
		for (auto &allocator : entry.allocator_infos) {
			for (auto &block : allocator.block_pointers) {
				checkpoint_manager.verify_block_usage_count[block.block_id]++;
			}
		}
	}
#endif

	// write empty block pointers for forwards compatibility
	vector<BlockPointer> compat_block_pointers;
	serializer.WriteProperty(103, "index_pointers", compat_block_pointers);
	serializer.WritePropertyWithDefault(104, "index_storage_infos", index_storage_infos);
}